

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

error_code pstore::exchange::import_ns::fragment_sections::check_fragment(fragment *f)

{
  bool bVar1;
  reference pvVar2;
  type *s;
  type *s_00;
  type *s_01;
  type *s_02;
  type *s_03;
  type *s_04;
  type *s_05;
  type *s_06;
  type *s_07;
  type *s_08;
  type *s_09;
  type *s_10;
  type *s_11;
  type *s_12;
  type *s_13;
  type *s_14;
  type *s_15;
  type *s_16;
  type *ptVar3;
  error_code eVar4;
  byte local_189;
  undefined4 uStack_184;
  undefined4 uStack_174;
  undefined4 uStack_164;
  undefined4 uStack_154;
  undefined4 uStack_144;
  undefined4 uStack_134;
  undefined4 uStack_124;
  undefined4 uStack_114;
  undefined4 uStack_104;
  undefined4 uStack_f4;
  undefined4 uStack_e4;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  undefined4 uStack_b4;
  undefined4 uStack_a4;
  undefined4 uStack_94;
  undefined4 uStack_84;
  undefined4 uStack_74;
  undefined4 uStack_64;
  undefined1 local_50 [7];
  section_kind kind;
  const_iterator end;
  const_iterator it;
  fragment *f_local;
  error_code error;
  
  std::error_code::error_code((error_code *)&f_local);
  repo::fragment::begin((const_iterator *)&end.value_,f);
  repo::fragment::end((const_iterator *)local_50,f);
  while( true ) {
    bVar1 = repo::details::
            cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
            ::operator!=((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                          *)&end.value_,
                         (cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                          *)local_50);
    local_189 = 0;
    if (bVar1) {
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)&f_local);
      local_189 = bVar1 ^ 0xff;
    }
    if ((local_189 & 1) == 0) break;
    pvVar2 = repo::details::
             cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
             ::operator*((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                          *)&end.value_);
    switch(*pvVar2) {
    case text:
      s = repo::fragment::at<(pstore::repo::section_kind)0>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_64,eVar4._M_value);
      break;
    case data:
      s_00 = repo::fragment::at<(pstore::repo::section_kind)1>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_00);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_74,eVar4._M_value);
      break;
    case bss:
      s_01 = repo::fragment::at<(pstore::repo::section_kind)2>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::bss_section>(f,s_01)
      ;
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_84,eVar4._M_value);
      break;
    case rel_ro:
      s_02 = repo::fragment::at<(pstore::repo::section_kind)3>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_02);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_94,eVar4._M_value);
      break;
    case mergeable_1_byte_c_string:
      s_03 = repo::fragment::at<(pstore::repo::section_kind)4>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_03);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_a4,eVar4._M_value);
      break;
    case mergeable_2_byte_c_string:
      s_04 = repo::fragment::at<(pstore::repo::section_kind)5>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_04);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_b4,eVar4._M_value);
      break;
    case mergeable_4_byte_c_string:
      s_05 = repo::fragment::at<(pstore::repo::section_kind)6>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_05);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_c4,eVar4._M_value);
      break;
    case mergeable_const_4:
      s_06 = repo::fragment::at<(pstore::repo::section_kind)7>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_06);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_d4,eVar4._M_value);
      break;
    case mergeable_const_8:
      s_07 = repo::fragment::at<(pstore::repo::section_kind)8>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_07);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_e4,eVar4._M_value);
      break;
    case mergeable_const_16:
      s_08 = repo::fragment::at<(pstore::repo::section_kind)9>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_08);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_f4,eVar4._M_value);
      break;
    case mergeable_const_32:
      s_09 = repo::fragment::at<(pstore::repo::section_kind)10>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_09);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_104,eVar4._M_value);
      break;
    case read_only:
      s_10 = repo::fragment::at<(pstore::repo::section_kind)11>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_10);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_114,eVar4._M_value);
      break;
    case thread_data:
      s_11 = repo::fragment::at<(pstore::repo::section_kind)12>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_11);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_124,eVar4._M_value);
      break;
    case thread_bss:
      s_12 = repo::fragment::at<(pstore::repo::section_kind)13>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_12);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_134,eVar4._M_value);
      break;
    case debug_line:
      s_13 = repo::fragment::at<(pstore::repo::section_kind)14>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::debug_line_section>
                        (f,s_13);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_144,eVar4._M_value);
      break;
    case debug_loc:
      s_14 = repo::fragment::at<(pstore::repo::section_kind)15>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_14);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_154,eVar4._M_value);
      break;
    case debug_string:
      s_15 = repo::fragment::at<(pstore::repo::section_kind)16>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_15);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_164,eVar4._M_value);
      break;
    case debug_ranges:
      s_16 = repo::fragment::at<(pstore::repo::section_kind)17>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::generic_section>
                        (f,s_16);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_174,eVar4._M_value);
      break;
    case linked_definitions:
      ptVar3 = repo::fragment::at<(pstore::repo::section_kind)18>(f);
      eVar4 = anon_unknown.dwarf_12a7ba::validate_section_ifixups<pstore::repo::linked_definitions>
                        (f,ptVar3);
      error._0_8_ = eVar4._M_cat;
      f_local = (fragment *)CONCAT44(uStack_184,eVar4._M_value);
      break;
    case last:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                    ,0x99);
    }
    repo::details::
    cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
    ::operator++((cast_iterator<pstore::repo::section_kind,_pstore::sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator>
                  *)&end.value_);
  }
  eVar4._0_8_ = (ulong)f_local & 0xffffffff;
  eVar4._M_cat = (error_category *)error._0_8_;
  return eVar4;
}

Assistant:

std::error_code fragment_sections::check_fragment (repo::fragment const & f) {
                std::error_code error;
                for (auto it = f.begin (), end = f.end (); it != end && !error; ++it) {
                    repo::section_kind const kind = *it;
#define X(k)                                                                                       \
    case repo::section_kind::k:                                                                    \
        error = validate_section_ifixups (f, f.at<repo::section_kind::k> ());                      \
        break;
                    switch (kind) {
                        PSTORE_MCREPO_SECTION_KINDS
                    case repo::section_kind::last:
                        PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about the assert macro)
                        break;
                    }
#undef X
                }
                return error;
            }